

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Talk.cpp
# Opt level: O2

void Handlers::Talk_Tell(Character *character,PacketReader *reader)

{
  World *pWVar1;
  int iVar2;
  time_t tVar3;
  mapped_type *this;
  Character *from;
  PacketBuilder *this_00;
  allocator<char> local_109;
  PacketBuilder reply;
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  string message;
  string local_78;
  undefined1 local_58 [32];
  string local_38;
  
  iVar2 = character->muted_until;
  tVar3 = time((time_t *)0x0);
  if (iVar2 <= tVar3) {
    PacketReader::GetBreakString_abi_cxx11_(&name,reader,0xff);
    PacketReader::GetEndString_abi_cxx11_(&message,reader);
    pWVar1 = character->world;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&reply,"ChatLength",(allocator<char> *)&local_b8);
    this = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&pWVar1->config,(key_type *)&reply);
    iVar2 = util::variant::GetInt(this);
    limit_message(&message,(long)iVar2);
    std::__cxx11::string::~string((string *)&reply);
    pWVar1 = character->world;
    std::__cxx11::string::string((string *)(local_58 + 0x20),(string *)&name);
    from = World::GetCharacter(pWVar1,(string *)(local_58 + 0x20));
    std::__cxx11::string::~string((string *)(local_58 + 0x20));
    if ((from == (Character *)0x0) || ((from->hidden & 2) != 0)) {
      PacketBuilder::PacketBuilder(&reply,PACKET_TALK,PACKET_REPLY,name._M_string_length + 2);
      PacketBuilder::AddShort(&reply,1);
      PacketBuilder::AddString(&reply,&name);
      Character::Send(character,&reply);
      PacketBuilder::~PacketBuilder(&reply);
    }
    else {
      if (from->whispers == true) {
        std::__cxx11::string::string((string *)local_58,(string *)&message);
        Character::Msg(from,character,(string *)local_58);
        this_00 = (PacketBuilder *)local_58;
      }
      else {
        pWVar1 = character->world;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&reply,"whisper_blocked",&local_109);
        (*(from->super_Command_Source)._vptr_Command_Source[2])(&local_b8,from);
        I18N::Format<std::__cxx11::string>(&local_78,&pWVar1->i18n,(string *)&reply,&local_b8);
        Character::Msg(character,from,&local_78);
        std::__cxx11::string::~string((string *)&local_78);
        std::__cxx11::string::~string((string *)&local_b8);
        this_00 = &reply;
      }
      std::__cxx11::string::~string((string *)this_00);
    }
    std::__cxx11::string::~string((string *)&message);
    std::__cxx11::string::~string((string *)&name);
  }
  return;
}

Assistant:

void Talk_Tell(Character *character, PacketReader &reader)
{
	if (character->muted_until > time(0)) return;

	std::string name = reader.GetBreakString();
	std::string message = reader.GetEndString();
	limit_message(message, static_cast<int>(character->world->config["ChatLength"]));
	Character *to = character->world->GetCharacter(name);

	if (to && !to->IsHideOnline())
	{
		if (to->whispers)
		{
			to->Msg(character, message);
		}
		else
		{
			character->Msg(to, character->world->i18n.Format("whisper_blocked", to->SourceName()));
		}
	}
	else
	{
		PacketBuilder reply(PACKET_TALK, PACKET_REPLY, 2 + name.length());
		reply.AddShort(TALK_NOTFOUND);
		reply.AddString(name);
		character->Send(reply);
	}
}